

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

int asl::local8toUtf32(char *u,int *p,int n)

{
  int *piVar1;
  bool bVar2;
  
  piVar1 = p;
  do {
    if (*u == '\0') {
      bVar2 = false;
    }
    else {
      *piVar1 = (int)*u;
      piVar1 = piVar1 + 1;
      n = n + -1;
      bVar2 = n != 0;
    }
    u = u + 1;
  } while (bVar2);
  *piVar1 = 0;
  return (int)((ulong)((long)piVar1 - (long)p) >> 2);
}

Assistant:

int local8toUtf32(const char* u, int* p, int n)
{
	const int* p0 = p;
	while (int c = *u++)
	{
		*p++ = c;
		if (--n == 0)
			break;
	}
	*p = 0;
	return int(p - p0);
}